

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDTDDescriptionImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLDTDDescriptionImpl::XMLDTDDescriptionImpl
          (XMLDTDDescriptionImpl *this,XMLCh *systemId,MemoryManager *memMgr)

{
  XMLCh *pXVar1;
  MemoryManager *memMgr_local;
  XMLCh *systemId_local;
  XMLDTDDescriptionImpl *this_local;
  
  XMLDTDDescription::XMLDTDDescription(&this->super_XMLDTDDescription,memMgr);
  (this->super_XMLDTDDescription).super_XMLGrammarDescription.super_XSerializable.
  _vptr_XSerializable = (_func_int **)&PTR__XMLDTDDescriptionImpl_00535d68;
  this->fSystemId = (XMLCh *)0x0;
  this->fRootName = (XMLCh *)0x0;
  if (systemId != (XMLCh *)0x0) {
    pXVar1 = XMLString::replicate(systemId,memMgr);
    this->fSystemId = pXVar1;
  }
  return;
}

Assistant:

XMLDTDDescriptionImpl::XMLDTDDescriptionImpl(const XMLCh*          const  systemId
                                           ,       MemoryManager*  const  memMgr  )
:XMLDTDDescription(memMgr)
,fSystemId(0)
,fRootName(0)
{
    if (systemId)
        fSystemId = XMLString::replicate(systemId, memMgr);
}